

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathConcatFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr value;
  xmlXPathObjectPtr obj;
  xmlChar *pxVar1;
  xmlChar *tmp;
  xmlXPathObjectPtr newobj;
  xmlXPathObjectPtr cur;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs < 2) {
    if (ctxt == (xmlXPathParserContextPtr)0x0) {
      return;
    }
    if (nargs != 2) {
      xmlXPathErr(ctxt,0xc);
      return;
    }
    if (ctxt->valueNr < 2) {
      xmlXPathErr(ctxt,0x17);
      return;
    }
  }
  if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
    xmlXPathStringFunction(ctxt,1);
  }
  value = xmlXPathValuePop(ctxt);
  if ((value == (xmlXPathObjectPtr)0x0) || (value->type != XPATH_STRING)) {
    xmlXPathReleaseObject(ctxt->context,value);
  }
  else {
    for (cur._4_4_ = nargs + -1; 0 < cur._4_4_; cur._4_4_ = cur._4_4_ + -1) {
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
        xmlXPathStringFunction(ctxt,1);
      }
      obj = xmlXPathValuePop(ctxt);
      if ((obj == (xmlXPathObjectPtr)0x0) || (obj->type != XPATH_STRING)) {
        xmlXPathReleaseObject(ctxt->context,obj);
        xmlXPathReleaseObject(ctxt->context,value);
        xmlXPathErr(ctxt,0xb);
        return;
      }
      pxVar1 = xmlStrcat(obj->stringval,value->stringval);
      if (pxVar1 == (xmlChar *)0x0) {
        xmlXPathPErrMemory(ctxt);
      }
      obj->stringval = value->stringval;
      value->stringval = pxVar1;
      xmlXPathReleaseObject(ctxt->context,obj);
    }
    xmlXPathValuePush(ctxt,value);
  }
  return;
}

Assistant:

void
xmlXPathConcatFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur, newobj;
    xmlChar *tmp;

    if (ctxt == NULL) return;
    if (nargs < 2) {
	CHECK_ARITY(2);
    }

    CAST_TO_STRING;
    cur = xmlXPathValuePop(ctxt);
    if ((cur == NULL) || (cur->type != XPATH_STRING)) {
	xmlXPathReleaseObject(ctxt->context, cur);
	return;
    }
    nargs--;

    while (nargs > 0) {
	CAST_TO_STRING;
	newobj = xmlXPathValuePop(ctxt);
	if ((newobj == NULL) || (newobj->type != XPATH_STRING)) {
	    xmlXPathReleaseObject(ctxt->context, newobj);
	    xmlXPathReleaseObject(ctxt->context, cur);
	    XP_ERROR(XPATH_INVALID_TYPE);
	}
	tmp = xmlStrcat(newobj->stringval, cur->stringval);
        if (tmp == NULL)
            xmlXPathPErrMemory(ctxt);
	newobj->stringval = cur->stringval;
	cur->stringval = tmp;
	xmlXPathReleaseObject(ctxt->context, newobj);
	nargs--;
    }
    xmlXPathValuePush(ctxt, cur);
}